

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O2

TestCaseGroup * vkt::compute::createIndirectComputeDispatchTests(TestContext *testCtx)

{
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  IndirectDispatchCaseBufferUpload *pIVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  DispatchCommandsVec vec_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> indirectComputeDispatchTests;
  DispatchCommandsVec vec;
  UVec3 local_3dc;
  UVec3 local_3d0;
  UVec3 local_3c4;
  UVec3 local_3b8;
  UVec3 local_3ac;
  UVec3 local_3a0;
  UVec3 local_394;
  UVec3 local_388;
  UVec3 local_37c;
  _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  local_370;
  _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  local_358;
  _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  local_340;
  _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  local_328;
  _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  local_310;
  _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  local_2f8;
  value_type local_2e0;
  value_type local_2c8;
  value_type local_2b0;
  value_type local_298;
  value_type local_280;
  value_type local_268;
  value_type local_250;
  value_type local_238;
  value_type local_220;
  value_type local_208;
  value_type local_1f0;
  value_type local_1d8;
  DispatchCommand local_1c0;
  DispatchCommand local_1a8;
  DispatchCommand local_190;
  DispatchCommand local_178;
  DispatchCommand local_160;
  DispatchCommand local_148;
  DispatchCommand local_130;
  Vector<unsigned_int,_3> local_114;
  Vector<unsigned_int,_3> local_108;
  Vector<unsigned_int,_3> local_fc;
  Vector<unsigned_int,_3> local_f0;
  Vector<unsigned_int,_3> local_e4;
  Vector<unsigned_int,_3> local_d8;
  Vector<unsigned_int,_3> local_cc;
  Vector<unsigned_int,_3> local_c0;
  Vector<unsigned_int,_3> local_b4;
  Vector<unsigned_int,_3> local_a8;
  Vector<unsigned_int,_3> local_9c;
  Vector<unsigned_int,_3> local_90;
  Vector<unsigned_int,_3> local_84;
  Vector<unsigned_int,_3> local_78;
  Vector<unsigned_int,_3> local_6c;
  Vector<unsigned_int,_3> local_60;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  
  if (createIndirectComputeDispatchTests(tcu::TestContext&)::s_dispatchCases == '\0') {
    iVar1 = __cxa_guard_acquire(&createIndirectComputeDispatchTests(tcu::TestContext&)::
                                 s_dispatchCases);
    if (iVar1 != 0) {
      local_37c.m_data[0] = 1;
      local_37c.m_data[1] = 1;
      uVar6 = 1;
      local_3c.m_data[0] = 1;
      local_3c.m_data[1] = 1;
      local_130.m_offset = 0;
      local_37c.m_data[2] = uVar6;
      local_3c.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_130.m_numWorkGroups,&local_3c);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&indirectComputeDispatchTests,&local_130);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases,"single_invocation",
                 "Single invocation only from offset 0",0xc,&local_37c,
                 (DispatchCommandsVec *)&indirectComputeDispatchTests);
      local_388.m_data[0] = 1;
      local_388.m_data[1] = 1;
      local_388.m_data[2] = 1;
      local_48.m_data[0] = 2;
      local_48.m_data[1] = 3;
      local_48.m_data[2] = 5;
      local_148.m_offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&local_148.m_numWorkGroups,&local_48);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&local_2f8,&local_148);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 1,"multiple_groups",
                 "Multiple groups dispatched from offset 0",0xc,&local_388,
                 (DispatchCommandsVec *)&local_2f8);
      local_394.m_data[0] = 2;
      local_394.m_data[1] = 3;
      local_394.m_data[2] = 1;
      local_54.m_data[0] = 1;
      local_54.m_data[1] = 2;
      local_54.m_data[2] = 3;
      local_160.m_offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&local_160.m_numWorkGroups,&local_54);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&local_310,&local_160);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 2,
                 "multiple_groups_multiple_invocations",
                 "Multiple groups of size 2x3x1 from offset 0",0xc,&local_394,
                 (DispatchCommandsVec *)&local_310);
      local_3a0.m_data[0] = 1;
      local_3a0.m_data[1] = 1;
      local_60.m_data[0] = 1;
      local_60.m_data[1] = 1;
      local_178.m_offset = 0x10;
      local_3a0.m_data[2] = uVar6;
      local_60.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_178.m_numWorkGroups,&local_60);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&local_328,&local_178);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 3,"small_offset",
                 "Small offset",0x1c,&local_3a0,(DispatchCommandsVec *)&local_328);
      local_3ac.m_data[0] = 1;
      local_3ac.m_data[1] = 1;
      local_6c.m_data[0] = 1;
      local_6c.m_data[1] = 1;
      local_190.m_offset = 0x10000c;
      local_3ac.m_data[2] = uVar6;
      local_6c.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_190.m_numWorkGroups,&local_6c);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&local_340,&local_190);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 4,"large_offset",
                 "Large offset",0x200000,&local_3ac,(DispatchCommandsVec *)&local_340);
      local_3b8.m_data[0] = 2;
      local_3b8.m_data[1] = 3;
      local_3b8.m_data[2] = 1;
      local_78.m_data[0] = 1;
      local_78.m_data[1] = 2;
      local_78.m_data[2] = 3;
      local_1a8.m_offset = 0x10000c;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1a8.m_numWorkGroups,&local_78);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&local_358,&local_1a8);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 5,
                 "large_offset_multiple_invocations","Large offset, multiple invocations",0x200000,
                 &local_3b8,(DispatchCommandsVec *)&local_358);
      local_3c4.m_data[0] = 1;
      local_3c4.m_data[1] = 1;
      local_84.m_data[0] = 0;
      local_84.m_data[1] = 0;
      local_3c4.m_data[2] = 1;
      local_84.m_data[2] = 0;
      local_1c0.m_offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1c0.m_numWorkGroups,&local_84);
      anon_unknown_1::commandsVec((DispatchCommandsVec *)&local_370,&local_1c0);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 6,"empty_command",
                 "Empty command",0xc,&local_3c4,(DispatchCommandsVec *)&local_370);
      local_3d0.m_data[0] = 3;
      local_3d0.m_data[1] = 1;
      local_3d0.m_data[2] = 2;
      local_90.m_data[0] = 1;
      local_90.m_data[1] = 1;
      local_1d8.m_offset = 0;
      local_90.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1d8.m_numWorkGroups,&local_90);
      local_9c.m_data[0] = 2;
      local_9c.m_data[1] = 1;
      local_1f0.m_offset = 0xc;
      local_9c.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_1f0.m_numWorkGroups,&local_9c);
      local_a8.m_data[0] = 1;
      local_a8.m_data[1] = 3;
      local_208.m_offset = 0x68;
      local_a8.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_208.m_numWorkGroups,&local_a8);
      local_b4.m_data[0] = 1;
      local_b4.m_data[1] = 1;
      local_b4.m_data[2] = 7;
      local_220.m_offset = 0x28;
      tcu::Vector<unsigned_int,_3>::Vector(&local_220.m_numWorkGroups,&local_b4);
      local_c0.m_data[0] = 1;
      local_c0.m_data[1] = 1;
      local_c0.m_data[2] = 4;
      local_238.m_offset = 0x34;
      tcu::Vector<unsigned_int,_3>::Vector(&local_238.m_numWorkGroups,&local_c0);
      vec.
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec.
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vec.
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec,&local_1d8);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec,&local_1f0);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec,&local_208);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec,&local_220);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec,&local_238);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 7,"multi_dispatch",
                 "Dispatch multiple compute commands from single buffer",0x400,&local_3d0,&vec);
      local_3dc.m_data[0] = 3;
      local_3dc.m_data[1] = 1;
      local_3dc.m_data[2] = 2;
      local_cc.m_data[0] = 1;
      local_cc.m_data[1] = 1;
      local_250.m_offset = 0;
      local_cc.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_250.m_numWorkGroups,&local_cc);
      local_d8.m_data[0] = 1;
      local_d8.m_data[1] = 1;
      local_268.m_offset = 0;
      local_d8.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_268.m_numWorkGroups,&local_d8);
      local_e4.m_data[0] = 1;
      local_e4.m_data[1] = 1;
      local_280.m_offset = 0;
      local_e4.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_280.m_numWorkGroups,&local_e4);
      local_f0.m_data[0] = 1;
      local_f0.m_data[1] = 3;
      local_298.m_offset = 0x68;
      local_f0.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_298.m_numWorkGroups,&local_f0);
      local_fc.m_data[0] = 1;
      local_fc.m_data[1] = 3;
      local_2b0.m_offset = 0x68;
      local_fc.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector(&local_2b0.m_numWorkGroups,&local_fc);
      local_108.m_data[0] = 1;
      local_108.m_data[1] = 1;
      local_2c8.m_offset = 0x34;
      local_108.m_data[2] = 4;
      tcu::Vector<unsigned_int,_3>::Vector(&local_2c8.m_numWorkGroups,&local_108);
      local_114.m_data[0] = 1;
      local_114.m_data[1] = 1;
      local_2e0.m_offset = 0x34;
      local_114.m_data[2] = 4;
      tcu::Vector<unsigned_int,_3>::Vector(&local_2e0.m_numWorkGroups,&local_114);
      vec_1.
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec_1.
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vec_1.
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_250);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_268);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_280);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_298);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_2b0);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_2c8);
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::push_back(&vec_1,&local_2e0);
      anon_unknown_1::DispatchCaseDesc::DispatchCaseDesc
                (createIndirectComputeDispatchTests::s_dispatchCases + 8,
                 "multi_dispatch_reuse_command",
                 "Dispatch multiple compute commands from single buffer",0x400,&local_3dc,&vec_1);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&vec_1.
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                     );
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&vec.
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                     );
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&local_370);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&local_358);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&local_340);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&local_328);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&local_310);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base(&local_2f8);
      std::
      _Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::~_Vector_base((_Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                       *)&indirectComputeDispatchTests);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createIndirectComputeDispatchTests(tcu::TestContext&)::s_dispatchCases);
    }
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"indirect_dispatch","Indirect dispatch tests");
  indirectComputeDispatchTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr = pTVar2;
  pTVar3 = (TestNode *)operator_new(0x70);
  pcVar5 = "";
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,testCtx,"upload_buffer","");
  tcu::TestNode::addChild
            (&(indirectComputeDispatchTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,pTVar3);
  for (lVar7 = 0; lVar7 != 0x240; lVar7 = lVar7 + 0x40) {
    pIVar4 = (IndirectDispatchCaseBufferUpload *)operator_new(0xa8);
    anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
              (pIVar4,testCtx,
               (DispatchCaseDesc *)
               ((long)&((DispatchCaseDesc *)
                       (&createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize + -2
                       ))->m_name + lVar7),(GLSLVersion)pcVar5);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar4);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  pcVar5 = "";
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,testCtx,"gen_in_compute","");
  tcu::TestNode::addChild
            (&(indirectComputeDispatchTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,pTVar3);
  for (lVar7 = 0;
      pTVar2 = indirectComputeDispatchTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar7 != 0x240; lVar7 = lVar7 + 0x40) {
    pIVar4 = (IndirectDispatchCaseBufferUpload *)operator_new(0xa8);
    anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
              (pIVar4,testCtx,
               (DispatchCaseDesc *)
               ((long)&((DispatchCaseDesc *)
                       (&createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize + -2
                       ))->m_name + lVar7),(GLSLVersion)pcVar5);
    (pIVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__IndirectDispatchCaseBufferUpload_00bd8b28;
    tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar4);
  }
  indirectComputeDispatchTests.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&indirectComputeDispatchTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createIndirectComputeDispatchTests (tcu::TestContext& testCtx)
{
	static const DispatchCaseDesc s_dispatchCases[] =
	{
		DispatchCaseDesc("single_invocation", "Single invocation only from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)))
        ),
		DispatchCaseDesc("multiple_groups", "Multiple groups dispatched from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(2, 3, 5)))
		),
		DispatchCaseDesc("multiple_groups_multiple_invocations", "Multiple groups of size 2x3x1 from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(2, 3, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 2, 3)))
		),
		DispatchCaseDesc("small_offset", "Small offset", 16 + INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(16, tcu::UVec3(1, 1, 1)))
		),
		DispatchCaseDesc("large_offset", "Large offset", (2 << 20), tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand((1 << 20) + 12, tcu::UVec3(1, 1, 1)))
		),
		DispatchCaseDesc("large_offset_multiple_invocations", "Large offset, multiple invocations", (2 << 20), tcu::UVec3(2, 3, 1),
			commandsVec(DispatchCommand((1 << 20) + 12, tcu::UVec3(1, 2, 3)))
		),
		DispatchCaseDesc("empty_command", "Empty command", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(0, 0, 0)))
		),
		DispatchCaseDesc("multi_dispatch", "Dispatch multiple compute commands from single buffer", 1 << 10, tcu::UVec3(3, 1, 2),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(INDIRECT_COMMAND_OFFSET, tcu::UVec3(2, 1, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(40, tcu::UVec3(1, 1, 7)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)))
		),
		DispatchCaseDesc("multi_dispatch_reuse_command", "Dispatch multiple compute commands from single buffer", 1 << 10, tcu::UVec3(3, 1, 2),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)))
		),
	};

	de::MovePtr<tcu::TestCaseGroup> indirectComputeDispatchTests(new tcu::TestCaseGroup(testCtx, "indirect_dispatch", "Indirect dispatch tests"));

	tcu::TestCaseGroup* const	groupBufferUpload = new tcu::TestCaseGroup(testCtx, "upload_buffer", "");
	indirectComputeDispatchTests->addChild(groupBufferUpload);

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_dispatchCases); ndx++)
	{
		groupBufferUpload->addChild(new IndirectDispatchCaseBufferUpload(testCtx, s_dispatchCases[ndx], glu::GLSL_VERSION_310_ES));
	}

	tcu::TestCaseGroup* const	groupBufferGenerate = new tcu::TestCaseGroup(testCtx, "gen_in_compute", "");
	indirectComputeDispatchTests->addChild(groupBufferGenerate);

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_dispatchCases); ndx++)
	{
		groupBufferGenerate->addChild(new IndirectDispatchCaseBufferGenerate(testCtx, s_dispatchCases[ndx], glu::GLSL_VERSION_310_ES));
	}

	return indirectComputeDispatchTests.release();
}